

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig
          (cmScriptGenerator *this,ostream *os,Indent *indent)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  pointer pbVar7;
  string config_test;
  allocator local_81;
  cmScriptGenerator *local_80;
  int local_74;
  string local_70;
  string local_50;
  
  pbVar7 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 != (this->ConfigurationTypes->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    if (pbVar7 != (this->ConfigurationTypes->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
      local_80 = this;
      do {
        pcVar1 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::string((string *)&local_70,pcVar1,(allocator *)&local_50);
        bVar3 = GeneratesForConfig(local_80,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p),
                          local_70.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          std::__cxx11::string::string((string *)&local_50,pcVar1,(allocator *)&local_74);
          CreateConfigTest(&local_70,local_80,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (0 < indent->Level) {
            iVar6 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              iVar6 = iVar6 + 1;
            } while (iVar6 < indent->Level);
          }
          pcVar5 = "elseif(";
          if (bVar2) {
            pcVar5 = "if(";
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)(byte)~bVar2 * 4 + 3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                                  (int)local_70._M_dataplus._M_p),
                              local_70._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
          std::__cxx11::string::string((string *)&local_50,pcVar1,&local_81);
          local_74 = indent->Level + 2;
          (*local_80->_vptr_cmScriptGenerator[5])(local_80,os,&local_50,&local_74);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p)
                            ,local_70.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != (local_80->ConfigurationTypes->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      if (!bVar2) {
        iVar6 = (*local_80->_vptr_cmScriptGenerator[7])();
        if ((char)iVar6 != '\0') {
          if (0 < indent->Level) {
            iVar6 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              iVar6 = iVar6 + 1;
            } while (iVar6 < indent->Level);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"else()\n",7);
          local_70._M_dataplus._M_p._0_4_ = indent->Level + 2;
          (*local_80->_vptr_cmScriptGenerator[6])(local_80,os);
        }
        if (0 < indent->Level) {
          iVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar6 = iVar6 + 1;
          } while (iVar6 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      }
    }
    return;
  }
  GenerateScriptActionsOnce(this,os,indent);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent const& indent)
{
  if(this->ConfigurationTypes->empty())
    {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
    }
  else
    {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for(std::vector<std::string>::const_iterator i =
          this->ConfigurationTypes->begin();
        i != this->ConfigurationTypes->end(); ++i)
      {
      const char* config = i->c_str();
      if(this->GeneratesForConfig(config))
        {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
        }
      }
    if(!first)
      {
      if(this->NeedsScriptNoConfig())
        {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
        }
      os << indent << "endif()\n";
      }
    }
}